

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O0

int VP8RecordCoeffTokens(int ctx,VP8Residual *res,VP8TBuffer *tokens)

{
  long lVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  int *in_RSI;
  uint32_t residue;
  uint8_t *tab;
  int mask;
  uint32_t v;
  int sign;
  int c;
  proba_t *s;
  uint32_t base_id;
  int n;
  int last;
  int coeff_type;
  int16_t *coeffs;
  uint32_t in_stack_ffffffffffffffac;
  uint8_t *in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb8;
  int iVar8;
  uint32_t in_stack_ffffffffffffffbc;
  uint32_t bit;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  int local_4;
  
  lVar1 = *(long *)(in_RSI + 2);
  local_2c = *in_RSI;
  uVar2 = AddToken((VP8TBuffer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                   (proba_t *)in_stack_ffffffffffffffb0);
  if (uVar2 == 0) {
    local_4 = 0;
  }
  else {
    do {
      do {
        if (0xf < local_2c) {
          return 1;
        }
        iVar7 = local_2c + 1;
        uVar3 = (uint32_t)*(short *)(lVar1 + (long)local_2c * 2);
        uVar4 = (uint)((int)uVar3 < 0);
        uVar2 = uVar3;
        if (uVar4 != 0) {
          uVar2 = -uVar3;
        }
        bit = uVar2;
        uVar5 = AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),uVar2,in_stack_ffffffffffffffb8,
                         (proba_t *)in_stack_ffffffffffffffb0);
        local_2c = iVar7;
      } while (uVar5 == 0);
      uVar5 = AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                       (proba_t *)in_stack_ffffffffffffffb0);
      if (uVar5 != 0) {
        uVar5 = AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                         (proba_t *)in_stack_ffffffffffffffb0);
        if (uVar5 == 0) {
          uVar5 = AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                           (proba_t *)in_stack_ffffffffffffffb0);
          if (uVar5 != 0) {
            AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                     (proba_t *)in_stack_ffffffffffffffb0);
          }
        }
        else {
          uVar5 = AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                           (proba_t *)in_stack_ffffffffffffffb0);
          if (uVar5 == 0) {
            uVar5 = AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                             (proba_t *)in_stack_ffffffffffffffb0);
            if (uVar5 == 0) {
              AddConstantToken((VP8TBuffer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                               uVar2);
            }
            else {
              AddConstantToken((VP8TBuffer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                               uVar2);
              AddConstantToken((VP8TBuffer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                               uVar2);
            }
          }
          else {
            uVar6 = bit - 3;
            if (uVar6 < 0x10) {
              AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                       (proba_t *)in_stack_ffffffffffffffb0);
              AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                       (proba_t *)in_stack_ffffffffffffffb0);
              in_stack_ffffffffffffffac = uVar6 - 8;
              iVar8 = 4;
              in_stack_ffffffffffffffb0 = VP8Cat3;
            }
            else if (uVar6 < 0x20) {
              AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                       (proba_t *)in_stack_ffffffffffffffb0);
              AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                       (proba_t *)in_stack_ffffffffffffffb0);
              in_stack_ffffffffffffffac = uVar6 - 0x10;
              iVar8 = 8;
              in_stack_ffffffffffffffb0 = VP8Cat4;
            }
            else if (uVar6 < 0x40) {
              AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                       (proba_t *)in_stack_ffffffffffffffb0);
              AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                       (proba_t *)in_stack_ffffffffffffffb0);
              in_stack_ffffffffffffffac = uVar6 - 0x20;
              iVar8 = 0x10;
              in_stack_ffffffffffffffb0 = VP8Cat5;
            }
            else {
              AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                       (proba_t *)in_stack_ffffffffffffffb0);
              AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                       (proba_t *)in_stack_ffffffffffffffb0);
              in_stack_ffffffffffffffac = uVar6 - 0x40;
              iVar8 = 0x400;
              in_stack_ffffffffffffffb0 = VP8Cat6;
            }
            for (; iVar8 != 0; iVar8 = iVar8 >> 1) {
              in_stack_ffffffffffffffb0 =
                   (uint8_t *)((long)&((VP8TBuffer *)in_stack_ffffffffffffffb0)->pages_ + 1);
              AddConstantToken((VP8TBuffer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                               uVar2);
            }
            in_stack_ffffffffffffffb8 = 0;
          }
        }
      }
      AddConstantToken((VP8TBuffer *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,uVar2);
    } while ((iVar7 != 0x10) &&
            (uVar2 = AddToken((VP8TBuffer *)CONCAT44(uVar3,uVar4),bit,in_stack_ffffffffffffffb8,
                              (proba_t *)in_stack_ffffffffffffffb0), uVar2 != 0));
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int VP8RecordCoeffTokens(int ctx, const struct VP8Residual* const res,
                         VP8TBuffer* const tokens) {
  const int16_t* const coeffs = res->coeffs;
  const int coeff_type = res->coeff_type;
  const int last = res->last;
  int n = res->first;
  uint32_t base_id = TOKEN_ID(coeff_type, n, ctx);
  // should be stats[VP8EncBands[n]], but it's equivalent for n=0 or 1
  proba_t* s = res->stats[n][ctx];
  if (!AddToken(tokens, last >= 0, base_id + 0, s + 0)) {
    return 0;
  }

  while (n < 16) {
    const int c = coeffs[n++];
    const int sign = c < 0;
    const uint32_t v = sign ? -c : c;
    if (!AddToken(tokens, v != 0, base_id + 1, s + 1)) {
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 0);  // ctx=0
      s = res->stats[VP8EncBands[n]][0];
      continue;
    }
    if (!AddToken(tokens, v > 1, base_id + 2, s + 2)) {
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 1);  // ctx=1
      s = res->stats[VP8EncBands[n]][1];
    } else {
      if (!AddToken(tokens, v > 4, base_id + 3, s + 3)) {
        if (AddToken(tokens, v != 2, base_id + 4, s + 4)) {
          AddToken(tokens, v == 4, base_id + 5, s + 5);
        }
      } else if (!AddToken(tokens, v > 10, base_id + 6, s + 6)) {
        if (!AddToken(tokens, v > 6, base_id + 7, s + 7)) {
          AddConstantToken(tokens, v == 6, 159);
        } else {
          AddConstantToken(tokens, v >= 9, 165);
          AddConstantToken(tokens, !(v & 1), 145);
        }
      } else {
        int mask;
        const uint8_t* tab;
        uint32_t residue = v - 3;
        if (residue < (8 << 1)) {          // VP8Cat3  (3b)
          AddToken(tokens, 0, base_id + 8, s + 8);
          AddToken(tokens, 0, base_id + 9, s + 9);
          residue -= (8 << 0);
          mask = 1 << 2;
          tab = VP8Cat3;
        } else if (residue < (8 << 2)) {   // VP8Cat4  (4b)
          AddToken(tokens, 0, base_id + 8, s + 8);
          AddToken(tokens, 1, base_id + 9, s + 9);
          residue -= (8 << 1);
          mask = 1 << 3;
          tab = VP8Cat4;
        } else if (residue < (8 << 3)) {   // VP8Cat5  (5b)
          AddToken(tokens, 1, base_id + 8, s + 8);
          AddToken(tokens, 0, base_id + 10, s + 9);
          residue -= (8 << 2);
          mask = 1 << 4;
          tab = VP8Cat5;
        } else {                         // VP8Cat6 (11b)
          AddToken(tokens, 1, base_id + 8, s + 8);
          AddToken(tokens, 1, base_id + 10, s + 9);
          residue -= (8 << 3);
          mask = 1 << 10;
          tab = VP8Cat6;
        }
        while (mask) {
          AddConstantToken(tokens, !!(residue & mask), *tab++);
          mask >>= 1;
        }
      }
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 2);  // ctx=2
      s = res->stats[VP8EncBands[n]][2];
    }
    AddConstantToken(tokens, sign, 128);
    if (n == 16 || !AddToken(tokens, n <= last, base_id + 0, s + 0)) {
      return 1;   // EOB
    }
  }
  return 1;
}